

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O1

QLayoutStyleInfo * __thiscall
QGraphicsAnchorLayoutPrivate::styleInfo(QGraphicsAnchorLayoutPrivate *this)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  QGraphicsLayoutItem *this_00;
  QGraphicsItem *this_01;
  QStyle *pQVar4;
  QGraphicsItem *this_02;
  long in_FS_OFFSET;
  undefined7 uStack_87;
  QStyleOption local_70;
  double local_30;
  double dStack_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->field_0x2c0 & 2) != 0) {
    this_00 = QGraphicsLayoutItem::parentLayoutItem
                        ((this->super_QGraphicsLayoutPrivate).super_QGraphicsLayoutItemPrivate.q_ptr
                        );
    if (this_00 == (QGraphicsLayoutItem *)0x0) {
LAB_005cd5d2:
      this_02 = (QGraphicsItem *)0x0;
    }
    else {
      this_02 = (QGraphicsItem *)0x0;
      do {
        bVar2 = QGraphicsLayoutItem::isLayout(this_00);
        if (!bVar2) {
          this_01 = QGraphicsLayoutItem::graphicsItem(this_00);
          if (this_01 == (QGraphicsItem *)0x0) goto LAB_005cd5d2;
          bVar2 = QGraphicsItem::isWidget(this_01);
          this_02 = (QGraphicsItem *)0x0;
          if (bVar2) {
            this_02 = this_01 + -1;
          }
          break;
        }
        this_00 = QGraphicsLayoutItem::parentLayoutItem(this_00);
      } while (this_00 != (QGraphicsLayoutItem *)0x0);
    }
    if (this_02 == (QGraphicsItem *)0x0) {
      pQVar4 = QApplication::style();
    }
    else {
      pQVar4 = QGraphicsWidget::style((QGraphicsWidget *)this_02);
    }
    QStyleOption::QStyleOption(&local_70,1,0);
    iVar3 = (**(code **)(*(long *)pQVar4 + 0xe0))(pQVar4,0x4f,&local_70,0);
    local_30 = (double)iVar3;
    iVar3 = (**(code **)(*(long *)pQVar4 + 0xe0))(pQVar4,0x50,&local_70,0);
    dStack_28 = (double)iVar3;
    *(ulong *)&this->cachedStyleInfo = CONCAT71(uStack_87,1);
    (this->cachedStyleInfo).m_style = pQVar4;
    (this->cachedStyleInfo).m_widget = (QWidget *)0x0;
    QStyleOption::operator=(&(this->cachedStyleInfo).m_styleOption,&local_70);
    (this->cachedStyleInfo).m_defaultSpacing[0] = local_30;
    (this->cachedStyleInfo).m_defaultSpacing[1] = dStack_28;
    QStyleOption::~QStyleOption(&local_70);
    dVar1 = (this->spacings).m_data[0];
    if (0.0 <= dVar1) {
      (this->cachedStyleInfo).m_defaultSpacing[0] = dVar1;
    }
    dVar1 = (this->spacings).m_data[1];
    if (0.0 <= dVar1) {
      (this->cachedStyleInfo).m_defaultSpacing[1] = dVar1;
    }
    this->field_0x2c0 = this->field_0x2c0 & 0xfd;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return &this->cachedStyleInfo;
}

Assistant:

QLayoutStyleInfo &QGraphicsAnchorLayoutPrivate::styleInfo() const
{
    if (styleInfoDirty) {
        Q_Q(const QGraphicsAnchorLayout);
        //### Fix this if QGV ever gets support for Metal style or different Aqua sizes.
        QWidget *wid = nullptr;

        QGraphicsLayoutItem *parent = q->parentLayoutItem();
        while (parent && parent->isLayout()) {
            parent = parent->parentLayoutItem();
        }
        QGraphicsWidget *w = nullptr;
        if (parent) {
            QGraphicsItem *parentItem = parent->graphicsItem();
            if (parentItem && parentItem->isWidget())
                w = static_cast<QGraphicsWidget*>(parentItem);
        }

        QStyle *style = w ? w->style() : QApplication::style();
        cachedStyleInfo = QLayoutStyleInfo(style, wid);
        cachedStyleInfo.setDefaultSpacing(Qt::Horizontal, spacings[Qt::Horizontal]);
        cachedStyleInfo.setDefaultSpacing(Qt::Vertical, spacings[Qt::Vertical]);

        styleInfoDirty = false;
    }
    return cachedStyleInfo;
}